

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::GenerateNodeGraph(Discreet3DSImporter *this,aiScene *pcOut)

{
  char *__haystack;
  uint uVar1;
  Node *node;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ai_uint32 aVar18;
  aiNode *paVar19;
  aiAnimation **ppaVar20;
  aiAnimation *paVar21;
  aiNodeAnim **ppaVar22;
  Logger *this_00;
  aiNode **ppaVar23;
  uint *puVar24;
  aiNode *paVar25;
  pointer ppaVar26;
  pointer ppaVar27;
  char *pcVar28;
  ulong uVar29;
  aiMatrix4x4 *in_R8;
  uint uVar30;
  Scene *pSVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint numChannel;
  uint local_34;
  
  paVar19 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar19);
  pcOut->mRootNode = paVar19;
  node = this->mRootNode;
  if ((node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"No hierarchy information has been found in the file. ");
    pSVar31 = this->mScene;
    pcOut->mRootNode->mNumChildren =
         (int)((ulong)((long)(pSVar31->mLights).
                             super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar31->mLights).
                            super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(pSVar31->mCameras).
                             super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar31->mCameras).
                            super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) + pcOut->mNumMeshes;
    paVar19 = pcOut->mRootNode;
    ppaVar23 = (aiNode **)operator_new__((ulong)paVar19->mNumChildren << 3);
    paVar19->mChildren = ppaVar23;
    paVar19 = pcOut->mRootNode;
    (paVar19->mName).length = 0xe;
    builtin_strncpy((paVar19->mName).data,"<3DSDummyRoot>",0xf);
    if (pcOut->mNumMeshes == 0) {
      uVar29 = 0;
    }
    else {
      uVar29 = 0;
      do {
        paVar19 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar19);
        pcOut->mRootNode->mChildren[uVar29] = paVar19;
        paVar19->mParent = pcOut->mRootNode;
        puVar24 = (uint *)operator_new__(4);
        paVar19->mMeshes = puVar24;
        *puVar24 = (uint)uVar29;
        paVar19->mNumMeshes = 1;
        aVar18 = snprintf((paVar19->mName).data,0x400,"3DSMesh_%u",uVar29 & 0xffffffff);
        (paVar19->mName).length = aVar18;
        uVar29 = uVar29 + 1;
      } while ((uint)uVar29 < pcOut->mNumMeshes);
    }
    uVar30 = (uint)uVar29;
    pSVar31 = this->mScene;
    if (((long)(pSVar31->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pSVar31->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar29 = 0;
      do {
        paVar25 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar25);
        pcOut->mRootNode->mChildren[uVar30 + (int)uVar29] = paVar25;
        paVar25->mParent = pcOut->mRootNode;
        pSVar31 = this->mScene;
        ppaVar26 = (pSVar31->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        paVar19 = (aiNode *)ppaVar26[uVar29];
        if (paVar25 != paVar19) {
          uVar1 = (paVar19->mName).length;
          (paVar25->mName).length = uVar1;
          memcpy((paVar25->mName).data,(paVar19->mName).data,(ulong)uVar1);
          (paVar25->mName).data[uVar1] = '\0';
          ppaVar26 = (pSVar31->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < ((ulong)((long)(pSVar31->mCameras).
                                       super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar26)
                         >> 3 & 0xffffffff));
      uVar30 = uVar30 + (int)uVar29;
    }
    if (((long)(pSVar31->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pSVar31->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
               super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar29 = 0;
      do {
        paVar25 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar25);
        pcOut->mRootNode->mChildren[uVar30 + uVar29 & 0xffffffff] = paVar25;
        paVar25->mParent = pcOut->mRootNode;
        pSVar31 = this->mScene;
        ppaVar27 = (pSVar31->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        paVar19 = (aiNode *)ppaVar27[uVar29];
        if (paVar25 != paVar19) {
          uVar1 = (paVar19->mName).length;
          (paVar25->mName).length = uVar1;
          memcpy((paVar25->mName).data,(paVar19->mName).data,(ulong)uVar1);
          (paVar25->mName).data[uVar1] = '\0';
          ppaVar27 = (pSVar31->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < ((ulong)((long)(pSVar31->mLights).
                                       super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar27)
                         >> 3 & 0xffffffff));
    }
  }
  else {
    local_34 = 0;
    CountTracks(node,&local_34);
    uVar29 = (ulong)local_34;
    if (uVar29 != 0) {
      pcOut->mNumAnimations = 1;
      ppaVar20 = (aiAnimation **)operator_new__(8);
      pcOut->mAnimations = ppaVar20;
      paVar21 = (aiAnimation *)operator_new(0x448);
      memset((paVar21->mName).data + 0xe,0x1b,0x3f2);
      paVar21->mDuration = -1.0;
      paVar21->mTicksPerSecond = 0.0;
      paVar21->mNumChannels = 0;
      paVar21->mChannels = (aiNodeAnim **)0x0;
      paVar21->mNumMeshChannels = 0;
      paVar21->mMeshChannels = (aiMeshAnim **)0x0;
      paVar21->mNumMorphMeshChannels = 0;
      paVar21->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *ppaVar20 = paVar21;
      (paVar21->mName).length = 0xd;
      builtin_strncpy((paVar21->mName).data,"3DSMasterAnim",0xe);
      ppaVar22 = (aiNodeAnim **)operator_new__(uVar29 << 3);
      paVar21->mChannels = ppaVar22;
    }
    AddNodeToGraph(this,pcOut,pcOut->mRootNode,this->mRootNode,in_R8);
  }
  if (pcOut->mNumMeshes != 0) {
    uVar29 = 0;
    do {
      pcOut->mMeshes[uVar29]->mColors[0] = (aiColor4D *)0x0;
      pcOut->mMeshes[uVar29]->mColors[1] = (aiColor4D *)0x0;
      uVar29 = uVar29 + 1;
    } while (uVar29 < pcOut->mNumMeshes);
  }
  paVar19 = pcOut->mRootNode;
  fVar2 = (paVar19->mTransformation).a1;
  fVar3 = (paVar19->mTransformation).a2;
  fVar4 = (paVar19->mTransformation).a3;
  fVar5 = (paVar19->mTransformation).a4;
  fVar6 = (paVar19->mTransformation).b1;
  fVar7 = (paVar19->mTransformation).b2;
  fVar8 = (paVar19->mTransformation).b3;
  fVar9 = (paVar19->mTransformation).b4;
  fVar10 = (paVar19->mTransformation).c1;
  fVar11 = (paVar19->mTransformation).c2;
  fVar12 = (paVar19->mTransformation).c3;
  fVar13 = (paVar19->mTransformation).c4;
  fVar14 = (paVar19->mTransformation).d1;
  fVar15 = (paVar19->mTransformation).d2;
  fVar16 = (paVar19->mTransformation).d3;
  fVar17 = (paVar19->mTransformation).d4;
  fVar36 = fVar2 * 0.0;
  fVar37 = fVar3 * 0.0;
  fVar38 = fVar4 * 0.0;
  fVar39 = fVar5 * 0.0;
  fVar44 = fVar6 * 0.0;
  fVar45 = fVar7 * 0.0;
  fVar46 = fVar8 * 0.0;
  fVar47 = fVar9 * 0.0;
  fVar40 = fVar36 + fVar44;
  fVar41 = fVar37 + fVar45;
  fVar42 = fVar38 + fVar46;
  fVar43 = fVar39 + fVar47;
  fVar48 = fVar10 * 0.0;
  fVar49 = fVar11 * 0.0;
  fVar50 = fVar12 * 0.0;
  fVar51 = fVar13 * 0.0;
  fVar32 = fVar14 * 0.0;
  fVar33 = fVar15 * 0.0;
  fVar34 = fVar16 * 0.0;
  fVar35 = fVar17 * 0.0;
  (paVar19->mTransformation).a1 = fVar44 + fVar2 + fVar48 + fVar32;
  (paVar19->mTransformation).a2 = fVar45 + fVar3 + fVar49 + fVar33;
  (paVar19->mTransformation).a3 = fVar46 + fVar4 + fVar50 + fVar34;
  (paVar19->mTransformation).a4 = fVar47 + fVar5 + fVar51 + fVar35;
  (paVar19->mTransformation).b1 = fVar40 + fVar10 + fVar32;
  (paVar19->mTransformation).b2 = fVar41 + fVar11 + fVar33;
  (paVar19->mTransformation).b3 = fVar42 + fVar12 + fVar34;
  (paVar19->mTransformation).b4 = fVar43 + fVar13 + fVar35;
  (paVar19->mTransformation).c1 = (fVar36 - fVar6) + fVar48 + fVar32;
  (paVar19->mTransformation).c2 = (fVar37 - fVar7) + fVar49 + fVar33;
  (paVar19->mTransformation).c3 = (fVar38 - fVar8) + fVar50 + fVar34;
  (paVar19->mTransformation).c4 = (fVar39 - fVar9) + fVar51 + fVar35;
  (paVar19->mTransformation).d1 = fVar48 + fVar40 + fVar14;
  (paVar19->mTransformation).d2 = fVar49 + fVar41 + fVar15;
  (paVar19->mTransformation).d3 = fVar50 + fVar42 + fVar16;
  (paVar19->mTransformation).d4 = fVar51 + fVar43 + fVar17;
  paVar19 = pcOut->mRootNode;
  __haystack = (paVar19->mName).data;
  pcVar28 = strstr(__haystack,"UNNAMED");
  if ((pcVar28 != (char *)0x0) || ((*__haystack == '$' && ((paVar19->mName).data[1] == '$')))) {
    (paVar19->mName).length = 9;
    builtin_strncpy(__haystack,"<3DSRoot>",10);
  }
  return;
}

Assistant:

void Discreet3DSImporter::GenerateNodeGraph(aiScene* pcOut)
{
    pcOut->mRootNode = new aiNode();
    if (0 == mRootNode->mChildren.size())
    {
        //////////////////////////////////////////////////////////////////////////////
        // It seems the file is so messed up that it has not even a hierarchy.
        // generate a flat hiearachy which looks like this:
        //
        //                ROOT_NODE
        //                   |
        //   ----------------------------------------
        //   |       |       |            |         |
        // MESH_0  MESH_1  MESH_2  ...  MESH_N    CAMERA_0 ....
        //
        ASSIMP_LOG_WARN("No hierarchy information has been found in the file. ");

        pcOut->mRootNode->mNumChildren = pcOut->mNumMeshes +
            static_cast<unsigned int>(mScene->mCameras.size() + mScene->mLights.size());

        pcOut->mRootNode->mChildren = new aiNode* [ pcOut->mRootNode->mNumChildren ];
        pcOut->mRootNode->mName.Set("<3DSDummyRoot>");

        // Build dummy nodes for all meshes
        unsigned int a = 0;
        for (unsigned int i = 0; i < pcOut->mNumMeshes;++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
            pcNode->mNumMeshes = 1;

            // Build a name for the node
            pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "3DSMesh_%u",i);
        }

        // Build dummy nodes for all cameras
        for (unsigned int i = 0; i < (unsigned int )mScene->mCameras.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mCameras[i]->mName;
        }

        // Build dummy nodes for all lights
        for (unsigned int i = 0; i < (unsigned int )mScene->mLights.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mLights[i]->mName;
        }
    }
    else
    {
        // First of all: find out how many scaling, rotation and translation
        // animation tracks we'll have afterwards
        unsigned int numChannel = 0;
        CountTracks(mRootNode,numChannel);

        if (numChannel)
        {
            // Allocate a primary animation channel
            pcOut->mNumAnimations = 1;
            pcOut->mAnimations    = new aiAnimation*[1];
            aiAnimation* anim     = pcOut->mAnimations[0] = new aiAnimation();

            anim->mName.Set("3DSMasterAnim");

            // Allocate enough storage for all node animation channels,
            // but don't set the mNumChannels member - we'll use it to
            // index into the array
            anim->mChannels = new aiNodeAnim*[numChannel];
        }

        aiMatrix4x4 m;
        AddNodeToGraph(pcOut,  pcOut->mRootNode, mRootNode,m);
    }

    // We used the first and second vertex color set to store some temporary values so we need to cleanup here
    for (unsigned int a = 0; a < pcOut->mNumMeshes; ++a)
    {
        pcOut->mMeshes[a]->mColors[0] = NULL;
        pcOut->mMeshes[a]->mColors[1] = NULL;
    }

    pcOut->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pcOut->mRootNode->mTransformation;

    // If the root node is unnamed name it "<3DSRoot>"
    if (::strstr( pcOut->mRootNode->mName.data, "UNNAMED" ) ||
        (pcOut->mRootNode->mName.data[0] == '$' && pcOut->mRootNode->mName.data[1] == '$') )
    {
        pcOut->mRootNode->mName.Set("<3DSRoot>");
    }
}